

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O1

void formatGestureHeader(QDebug *d,char *className,QGesture *gesture)

{
  char *pcVar1;
  double dVar2;
  int iVar3;
  QTextStream *pQVar4;
  storage_type *psVar5;
  long lVar6;
  storage_type *psVar7;
  Stream *this;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  undefined1 local_58 [16];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QTextStream *)d->stream;
  if (className == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar5 + 1;
      pcVar1 = className + 1 + (long)psVar5;
      psVar5 = psVar7;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar7;
  QVar8.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)d->stream,' ');
  }
  pQVar4 = (QTextStream *)d->stream;
  QVar9.m_data = (storage_type *)0x7;
  QVar9.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)d->stream,' ');
  }
  iVar3 = *(int *)(*(long *)&gesture->field_0x8 + 0x7c);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
  local_58 = QMetaObject::enumerator(0x840328);
  lVar6 = QMetaEnum::valueToKey((ulonglong)local_58);
  pQVar4 = (QTextStream *)d->stream;
  if (lVar6 == 0) {
    QTextStream::operator<<(pQVar4,iVar3);
    this = d->stream;
    if (this[0x30] != (Stream)0x1) goto LAB_002ceb70;
  }
  else {
    psVar7 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar7 + lVar6 + 1;
      psVar7 = psVar7 + 1;
    } while (*pcVar1 != '\0');
    QVar10.m_data = psVar7;
    QVar10.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar4,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    this = d->stream;
    if (this[0x30] == (Stream)0x0) goto LAB_002ceb70;
  }
  QTextStream::operator<<((QTextStream *)this,' ');
LAB_002ceb70:
  if ((*(byte *)(*(long *)&gesture->field_0x8 + 0xa0) & 1) != 0) {
    pQVar4 = (QTextStream *)d->stream;
    QVar11.m_data = (storage_type *)0x9;
    QVar11.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<(pQVar4,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)d->stream,' ');
    }
    dVar2 = *(double *)(*(long *)&gesture->field_0x8 + 0x88);
    QTextStream::operator<<
              ((QTextStream *)d->stream,*(double *)(*(long *)&gesture->field_0x8 + 0x80));
    if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)d->stream,' ');
    }
    QTextStream::operator<<((QTextStream *)d->stream,',');
    if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)d->stream,' ');
    }
    QTextStream::operator<<((QTextStream *)d->stream,dVar2);
    if (((QTextStream *)d->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)d->stream,' ');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void formatGestureHeader(QDebug d, const char *className, const QGesture *gesture)
{
     d << className << "(state=";
     QtDebugUtils::formatQEnum(d, gesture->state());
     if (gesture->hasHotSpot()) {
         d << ",hotSpot=";
         QtDebugUtils::formatQPoint(d, gesture->hotSpot());
     }
}